

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal.cpp
# Opt level: O0

int PAL_InitializeChakraCore(void)

{
  int iVar1;
  BOOL BVar2;
  LONG LVar3;
  int *lpAddend;
  DWORD local_c;
  
  iVar1 = Volatile::operator_cast_to_int((Volatile *)&init_count);
  if (iVar1 < 1) {
    PAL_InitializeChakraCoreCalled = true;
    iVar1 = Initialize();
    if (iVar1 == 0) {
      BVar2 = VIRTUALInitialize();
      if (BVar2 == 0) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        local_c = 0x1f;
      }
      else {
        lpAddend = Volatile<int>::operator&(&g_chakraCoreInitialized);
        LVar3 = InterlockedIncrement(lpAddend);
        if (LVar3 < 2) {
          local_c = 0;
        }
        else {
          PAL_Enter(PAL_BoundaryTop);
          local_c = 0;
        }
      }
    }
    else {
      local_c = GetLastError();
    }
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

int
PALAPI
PAL_InitializeChakraCore()
{
    // this is not thread safe but PAL_InitializeChakraCore is per process
    // besides, calling Jsrt initializer function is thread safe
    if (init_count > 0) return ERROR_SUCCESS;
#if defined(ENABLE_CC_XPLAT_TRACE) || defined(DEBUG)
    PAL_InitializeChakraCoreCalled = true;
#endif

    if (Initialize())
    {
        return GetLastError();
    }

    if (FALSE == VIRTUALInitialize())
    {
        ERROR("Unable to initialize virtual memory support\n");
        return ERROR_GEN_FAILURE;
    }

    // Check for a repeated call (this is a no-op).
    if (InterlockedIncrement(&g_chakraCoreInitialized) > 1)
    {
        PAL_Enter(PAL_BoundaryTop);
        return ERROR_SUCCESS;
    }

    return ERROR_SUCCESS;
}